

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float x0;
  float y0;
  ulong uVar1;
  ImVec2 IVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  CustomRect *pCVar7;
  ImFont *pIVar8;
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  long lVar12;
  int i;
  int iVar13;
  long lVar14;
  long lVar15;
  int i_1;
  ImVec2 local_40;
  ImVec2 local_38;
  
  iVar4 = atlas->CustomRectIds[0];
  iVar5 = atlas->TexWidth;
  pCVar7 = (atlas->CustomRects).Data;
  if ((atlas->Flags & 2) == 0) {
    lVar12 = 0;
    for (iVar13 = 0; iVar13 != 0x1b; iVar13 = iVar13 + 1) {
      for (lVar14 = 0; (int)lVar14 != 0x6c; lVar14 = lVar14 + 1) {
        cVar3 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                [(int)lVar12 + lVar14];
        lVar15 = (long)(int)((uint)pCVar7[iVar4].X + (int)lVar14 +
                            ((uint)pCVar7[iVar4].Y + iVar13) * iVar5);
        atlas->TexPixelsAlpha8[lVar15] = -(cVar3 == '.');
        atlas->TexPixelsAlpha8[lVar15 + 0x6d] = -(cVar3 == 'X');
      }
      lVar12 = (int)lVar12 + lVar14;
    }
  }
  else {
    lVar14 = (ulong)pCVar7[iVar4].Y * (long)iVar5 + (ulong)pCVar7[iVar4].X;
    lVar12 = (long)(iVar5 + (int)lVar14);
    atlas->TexPixelsAlpha8[lVar12 + 1] = 0xff;
    atlas->TexPixelsAlpha8[lVar12] = 0xff;
    atlas->TexPixelsAlpha8[lVar14 + 1] = 0xff;
    atlas->TexPixelsAlpha8[lVar14] = 0xff;
  }
  pCVar7 = pCVar7 + iVar4;
  uVar1._0_2_ = pCVar7->X;
  uVar1._2_2_ = pCVar7->Y;
  uVar1._4_4_ = pCVar7->GlyphAdvanceX;
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9._12_2_ = (short)((uint)uVar1._4_4_ >> 0x10);
  auVar10._8_2_ = (short)uVar1._4_4_;
  auVar10._0_8_ = uVar1;
  auVar10._10_4_ = auVar9._10_4_;
  auVar11._6_8_ = 0;
  auVar11._0_6_ = auVar10._8_6_;
  IVar2 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar2.x * ((float)(ushort)(undefined2)uVar1 + 0.5);
  (atlas->TexUvWhitePixel).y =
       IVar2.y * ((float)(int)CONCAT82(SUB148(auVar11 << 0x40,6),uVar1._2_2_) + 0.5);
  lVar14 = 0;
  for (lVar12 = 0; lVar12 < (atlas->CustomRects).Size; lVar12 = lVar12 + 1) {
    pCVar7 = (atlas->CustomRects).Data;
    pIVar8 = *(ImFont **)((long)&pCVar7->Font + lVar14);
    uVar6 = *(uint *)((long)&pCVar7->ID + lVar14);
    if (uVar6 < 0x10001 && pIVar8 != (ImFont *)0x0) {
      local_38.x = 0.0;
      local_38.y = 0.0;
      local_40.x = 0.0;
      local_40.y = 0.0;
      ImFontAtlas::CalcCustomRectUV
                (atlas,(CustomRect *)((long)&pCVar7->ID + lVar14),&local_38,&local_40);
      x0 = *(float *)((long)&(pCVar7->GlyphOffset).x + lVar14);
      y0 = *(float *)((long)&(pCVar7->GlyphOffset).y + lVar14);
      ImFont::AddGlyph(pIVar8,(ImWchar)uVar6,x0,y0,
                       (float)*(ushort *)((long)&pCVar7->Width + lVar14) + x0,
                       (float)*(ushort *)((long)&pCVar7->Height + lVar14) + y0,local_38.x,local_38.y
                       ,local_40.x,local_40.y,*(float *)((long)&pCVar7->GlyphAdvanceX + lVar14));
    }
    lVar14 = lVar14 + 0x20;
  }
  for (lVar12 = 0; lVar12 < (atlas->Fonts).Size; lVar12 = lVar12 + 1) {
    pIVar8 = (atlas->Fonts).Data[lVar12];
    if (pIVar8->DirtyLookupTables == true) {
      ImFont::BuildLookupTable(pIVar8);
    }
  }
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data block
    ImFontAtlasBuildRenderDefaultTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlas::CustomRect& r = atlas->CustomRects[i];
        if (r.Font == NULL || r.ID > 0x10000)
            continue;

        IM_ASSERT(r.Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(&r, &uv0, &uv1);
        r.Font->AddGlyph((ImWchar)r.ID, r.GlyphOffset.x, r.GlyphOffset.y, r.GlyphOffset.x + r.Width, r.GlyphOffset.y + r.Height, uv0.x, uv0.y, uv1.x, uv1.y, r.GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();
}